

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.hxx
# Opt level: O0

void __thiscall args::Group::Validate(Group *this,string *shortPrefix,string *longPrefix)

{
  bool bVar1;
  vector<args::Base_*,_std::allocator<args::Base_*>_> *this_00;
  reference ppBVar2;
  Base *child;
  const_iterator __end2;
  const_iterator __begin2;
  vector<args::Base_*,_std::allocator<args::Base_*>_> *__range2;
  string *longPrefix_local;
  string *shortPrefix_local;
  Group *this_local;
  
  this_00 = Children(this);
  __end2 = std::vector<args::Base_*,_std::allocator<args::Base_*>_>::begin(this_00);
  child = (Base *)std::vector<args::Base_*,_std::allocator<args::Base_*>_>::end(this_00);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<args::Base_*const_*,_std::vector<args::Base_*,_std::allocator<args::Base_*>_>_>
                                *)&child);
    if (!bVar1) break;
    ppBVar2 = __gnu_cxx::
              __normal_iterator<args::Base_*const_*,_std::vector<args::Base_*,_std::allocator<args::Base_*>_>_>
              ::operator*(&__end2);
    (*(*ppBVar2)->_vptr_Base[3])(*ppBVar2,shortPrefix,longPrefix);
    __gnu_cxx::
    __normal_iterator<args::Base_*const_*,_std::vector<args::Base_*,_std::allocator<args::Base_*>_>_>
    ::operator++(&__end2);
  }
  return;
}

Assistant:

virtual void Validate(const std::string &shortPrefix, const std::string &longPrefix) const override
            {
                for (Base *child: Children())
                {
                    child->Validate(shortPrefix, longPrefix);
                }
            }